

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int moveto_node_check(lyd_node *node,lyxp_node_type root_type,char *node_name,lys_module *moveto_mod
                     ,int options)

{
  int iVar1;
  lys_module *plVar2;
  
  if ((moveto_mod != (lys_module *)0x0) &&
     (plVar2 = lys_node_module(node->schema), plVar2 != moveto_mod)) {
    return -1;
  }
  if ((root_type != LYXP_NODE_ROOT_CONFIG) || (iVar1 = -1, (node->schema->flags & 2) == 0)) {
    if ((node->schema->name != node_name) && (iVar1 = strcmp(node_name,"*"), iVar1 != 0)) {
      return -1;
    }
    if (((options & 2U) == 0) || (iVar1 = 1, (node->field_0x9 & 0xe) != 8)) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
moveto_node_check(struct lyd_node *node, enum lyxp_node_type root_type, const char *node_name,
                  struct lys_module *moveto_mod, int options)
{
    /* module check */
    if (moveto_mod && (lys_node_module(node->schema) != moveto_mod)) {
        return -1;
    }

    /* context check */
    if ((root_type == LYXP_NODE_ROOT_CONFIG) && (node->schema->flags & LYS_CONFIG_R)) {
        return -1;
    }

    /* name check */
    if (!ly_strequal(node->schema->name, node_name, 1) && strcmp(node_name, "*")) {
        return -1;
    }

    /* when check */
    if ((options & LYXP_WHEN) && !LYD_WHEN_DONE(node->when_status)) {
        return EXIT_FAILURE;
    }

    /* match */
    return EXIT_SUCCESS;
}